

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitops.h
# Opt level: O0

uint8_t select_u8(uint32_t i,uint8_t *tab,uint32_t n)

{
  byte bVar1;
  uint local_24;
  uint8_t mask;
  uint32_t ii;
  uint8_t r;
  uint32_t n_local;
  uint8_t *tab_local;
  uint32_t i_local;
  
  mask = '\0';
  for (local_24 = 0; local_24 < n; local_24 = local_24 + 1) {
    bVar1 = mask_u8(i,local_24);
    mask = mask & (bVar1 ^ 0xff) | tab[local_24] & bVar1;
  }
  return mask;
}

Assistant:

static inline uint8_t select_u8(uint32_t i, volatile const uint8_t *tab, uint32_t n)
{
  uint8_t r = 0;
  uint32_t ii;

  for (ii = 0; ii < n; ii++)
  {
    uint8_t mask = mask_u8(i, ii);
    r = (r & ~mask) | (tab[ii] & mask);
  }

  return r;
}